

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSweep.c
# Opt level: O0

Gia_Obj_t * Gia_ManFraigMarkAnd(Gia_Man_t *p,Gia_Obj_t *pObj)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  Gia_Obj_t *local_18;
  Gia_Obj_t *pObj_local;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ObjIsAnd(pObj);
  local_18 = pObj;
  if (iVar1 == 0) {
    __assert_fail("Gia_ObjIsAnd(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSweep.c"
                  ,0xf7,"Gia_Obj_t *Gia_ManFraigMarkAnd(Gia_Man_t *, Gia_Obj_t *)");
  }
  while (iVar1 = Gia_ObjIsAnd(local_18), iVar1 != 0) {
    iVar1 = Gia_ObjIsTravIdCurrent(p,local_18);
    if (iVar1 != 0) {
      pGVar2 = Gia_ObjFanin0(local_18);
      Gia_ObjSetTravIdCurrent(p,pGVar2);
      pGVar2 = Gia_ObjFanin1(local_18);
      Gia_ObjSetTravIdCurrent(p,pGVar2);
    }
    local_18 = local_18 + -1;
  }
  return local_18;
}

Assistant:

Gia_Obj_t * Gia_ManFraigMarkAnd( Gia_Man_t * p, Gia_Obj_t * pObj )
{
    for ( assert( Gia_ObjIsAnd(pObj) ); Gia_ObjIsAnd(pObj); pObj-- )
        if ( Gia_ObjIsTravIdCurrent(p, pObj) )
        {
            Gia_ObjSetTravIdCurrent( p, Gia_ObjFanin0(pObj) );
            Gia_ObjSetTravIdCurrent( p, Gia_ObjFanin1(pObj) );
        }
    return pObj;
}